

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::DBTest::DestroyAndReopen(DBTest *this,Options *options)

{
  bool bVar1;
  char *message;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_a0 [24];
  AssertionResult gtest_ar;
  Status local_20;
  Options *local_18;
  Options *options_local;
  DBTest *this_local;
  
  local_18 = options;
  options_local = (Options *)this;
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  this->db_ = (DB *)0x0;
  Options::Options((Options *)&gtest_ar.message_);
  DestroyDB((leveldb *)&local_20,&this->dbname_,(Options *)&gtest_ar.message_);
  Status::~Status(&local_20);
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  TryReopen((DBTest *)local_a0,(Options *)this);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)(local_a0 + 0x10),
             local_a0 + 0xf,(Status *)"TryReopen(options)");
  Status::~Status((Status *)local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_a0 + 0x10));
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)(local_a0 + 0x10));
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,299,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_a0 + 0x10));
  return;
}

Assistant:

void DestroyAndReopen(Options* options = nullptr) {
    delete db_;
    db_ = nullptr;
    DestroyDB(dbname_, Options());
    ASSERT_LEVELDB_OK(TryReopen(options));
  }